

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IGXMLScanner2.cpp
# Opt level: O1

void __thiscall
xercesc_4_0::IGXMLScanner::scanRawAttrListforNameSpaces(IGXMLScanner *this,XMLSize_t attCount)

{
  short *psVar1;
  short *psVar2;
  XMLCh XVar3;
  XMLCh XVar4;
  ushort uVar5;
  XMLValidator *pXVar6;
  undefined2 *puVar7;
  SchemaValidator *pSVar8;
  XMLBufferMgr *pXVar9;
  int iVar10;
  uint uVar11;
  KVStringPair *pKVar12;
  XMLCh *pXVar13;
  XMLCh *pXVar14;
  XMLCh *pXVar15;
  Grammar *pGVar16;
  undefined4 extraout_var;
  undefined8 *puVar17;
  ReaderMgr *this_00;
  XMLBuffer *pXVar18;
  ulong uVar19;
  undefined1 uVar20;
  XMLCh *pXVar21;
  DatatypeValidator *pDVar22;
  short sVar23;
  long lVar24;
  ushort *puVar25;
  XMLSize_t index;
  XMLSize_t XVar26;
  XMLSize_t XVar27;
  int colonPos;
  RefHashTableOfEnumerator<xercesc_4_0::Grammar,_xercesc_4_0::StringHasher> i;
  int local_9c;
  XMLSize_t local_98;
  XMLBufferMgr *local_90;
  XMLBuffer *local_88;
  undefined1 local_80 [16];
  RefHashTableBucketElem<xercesc_4_0::Grammar> *local_70;
  XMLSize_t local_68;
  RefHashTableOf<xercesc_4_0::Grammar,_xercesc_4_0::StringHasher> *local_60;
  XMLBuffer *local_50;
  long local_48;
  XMLCh *local_40;
  XMLCh *local_38;
  
  local_98 = attCount;
  if (attCount != 0) {
    XVar27 = 0;
    do {
      pKVar12 = BaseRefVectorOf<xercesc_4_0::KVStringPair>::elementAt
                          (&this->fRawAttrList->super_BaseRefVectorOf<xercesc_4_0::KVStringPair>,
                           XVar27);
      pXVar14 = pKVar12->fKey;
      iVar10 = XMLString::compareNString(pXVar14,L"xmlns:",6);
      if ((pXVar14 == L"xmlns") || (iVar10 == 0)) {
LAB_002aef69:
        pXVar13 = pKVar12->fValue;
        updateNSMap(this,pXVar14,pXVar13,this->fRawAttrColonList[XVar27]);
        if (pXVar13 == L"http://www.w3.org/2001/XMLSchema-instance") {
LAB_002aefb7:
          this->fSeeXsi = true;
        }
        else {
          pXVar14 = L"http://www.w3.org/2001/XMLSchema-instance";
          if (pXVar13 == (XMLCh *)0x0) {
LAB_002aefb1:
            if (*pXVar14 == L'\0') goto LAB_002aefb7;
          }
          else {
            pXVar14 = L"http://www.w3.org/2001/XMLSchema-instance";
            do {
              XVar3 = *pXVar13;
              if (XVar3 == L'\0') goto LAB_002aefb1;
              pXVar13 = pXVar13 + 1;
              XVar4 = *pXVar14;
              pXVar14 = pXVar14 + 1;
            } while (XVar3 == XVar4);
          }
        }
      }
      else {
        pXVar13 = L"xmlns";
        if (pXVar14 == (XMLCh *)0x0) {
LAB_002aef63:
          if (*pXVar13 == L'\0') goto LAB_002aef69;
        }
        else {
          pXVar13 = L"xmlns";
          pXVar15 = pXVar14;
          do {
            XVar3 = *pXVar15;
            if (XVar3 == L'\0') goto LAB_002aef63;
            pXVar15 = pXVar15 + 1;
            XVar4 = *pXVar13;
            pXVar13 = pXVar13 + 1;
          } while (XVar3 == XVar4);
        }
      }
      XVar27 = XVar27 + 1;
    } while (XVar27 != local_98);
  }
  if ((((this->super_XMLScanner).fDoSchema != false) && (local_98 != 0)) && (this->fSeeXsi != false)
     ) {
    local_88 = &(this->super_XMLScanner).fURIBuf;
    XVar27 = 0;
    do {
      pKVar12 = BaseRefVectorOf<xercesc_4_0::KVStringPair>::elementAt
                          (&this->fRawAttrList->super_BaseRefVectorOf<xercesc_4_0::KVStringPair>,
                           XVar27);
      pXVar14 = pKVar12->fKey;
      XVar26 = (XMLSize_t)this->fRawAttrColonList[XVar27];
      pXVar13 = L"";
      if (XVar26 != 0xffffffffffffffff) {
        (this->super_XMLScanner).fURIBuf.fIndex = 0;
        XMLBuffer::append(local_88,pXVar14,XVar26);
        pXVar13 = (this->super_XMLScanner).fURIBuf.fBuffer;
        pXVar13[(this->super_XMLScanner).fURIBuf.fIndex] = L'\0';
      }
      uVar11 = XMLScanner::resolvePrefix(&this->super_XMLScanner,pXVar13,Mode_Attribute);
      if (uVar11 == (this->super_XMLScanner).fSchemaNamespaceId) {
        pXVar14 = pXVar14 + XVar26 + 1;
        if (pXVar14 == L"schemaLocation") {
LAB_002af0f1:
          parseSchemaLocation(this,pKVar12->fValue,false);
        }
        else {
          pXVar13 = L"schemaLocation";
          if (pXVar14 == (XMLCh *)0x0) {
LAB_002af0b5:
            if (*pXVar13 == L'\0') goto LAB_002af0f1;
          }
          else {
            pXVar13 = L"schemaLocation";
            pXVar15 = pXVar14;
            do {
              XVar3 = *pXVar15;
              if (XVar3 == L'\0') goto LAB_002af0b5;
              pXVar15 = pXVar15 + 1;
              XVar4 = *pXVar13;
              pXVar13 = pXVar13 + 1;
            } while (XVar3 == XVar4);
          }
          if (pXVar14 == L"noNamespaceSchemaLocation") {
LAB_002af103:
            resolveSchemaGrammar(this,pKVar12->fValue,L"",false);
          }
          else {
            pXVar13 = L"noNamespaceSchemaLocation";
            if (pXVar14 == (XMLCh *)0x0) {
LAB_002af0fd:
              if (*pXVar13 == L'\0') goto LAB_002af103;
            }
            else {
              pXVar13 = L"noNamespaceSchemaLocation";
              do {
                XVar3 = *pXVar14;
                if (XVar3 == L'\0') goto LAB_002af0fd;
                pXVar14 = pXVar14 + 1;
                XVar4 = *pXVar13;
                pXVar13 = pXVar13 + 1;
              } while (XVar3 == XVar4);
            }
          }
        }
      }
      XVar27 = XVar27 + 1;
    } while (XVar27 != local_98);
    local_90 = &(this->super_XMLScanner).fBufMgr;
    local_50 = &(this->super_XMLScanner).fPrefixBuf;
    XVar27 = 0;
    do {
      pKVar12 = BaseRefVectorOf<xercesc_4_0::KVStringPair>::elementAt
                          (&this->fRawAttrList->super_BaseRefVectorOf<xercesc_4_0::KVStringPair>,
                           XVar27);
      pXVar14 = pKVar12->fKey;
      XVar26 = (XMLSize_t)this->fRawAttrColonList[XVar27];
      pXVar13 = L"";
      if (XVar26 != 0xffffffffffffffff) {
        (this->super_XMLScanner).fURIBuf.fIndex = 0;
        XMLBuffer::append(local_88,pXVar14,XVar26);
        pXVar13 = (this->super_XMLScanner).fURIBuf.fBuffer;
        pXVar13[(this->super_XMLScanner).fURIBuf.fIndex] = L'\0';
      }
      uVar11 = XMLScanner::resolvePrefix(&this->super_XMLScanner,pXVar13,Mode_Attribute);
      if (uVar11 != (this->super_XMLScanner).fSchemaNamespaceId) goto LAB_002af728;
      pXVar13 = pKVar12->fValue;
      pXVar14 = pXVar14 + XVar26 + 1;
      if (pXVar14 == L"type") {
LAB_002af252:
        pXVar6 = (this->super_XMLScanner).fValidator;
        if ((pXVar6 == (XMLValidator *)0x0) ||
           (iVar10 = (*pXVar6->_vptr_XMLValidator[0xd])(), (char)iVar10 == '\0')) {
          (*((this->super_XMLScanner).fGrammarResolver)->fGrammarPool->_vptr_XMLGrammarPool[5])
                    ((RefHashTableOfEnumerator<xercesc_4_0::Grammar,_xercesc_4_0::StringHasher> *)
                     local_80);
          do {
            if ((local_70 == (RefHashTableBucketElem<xercesc_4_0::Grammar> *)0x0) &&
               (local_68 == local_60->fHashModulus)) goto LAB_002af2c8;
            pGVar16 = RefHashTableOfEnumerator<xercesc_4_0::Grammar,_xercesc_4_0::StringHasher>::
                      nextElement((RefHashTableOfEnumerator<xercesc_4_0::Grammar,_xercesc_4_0::StringHasher>
                                   *)local_80);
            iVar10 = (*(pGVar16->super_XSerializable)._vptr_XSerializable[5])(pGVar16);
          } while (iVar10 != 1);
          iVar10 = (*(pGVar16->super_XSerializable)._vptr_XSerializable[6])(pGVar16);
          switchGrammar(this,(XMLCh *)CONCAT44(extraout_var,iVar10));
LAB_002af2c8:
          RefHashTableOfEnumerator<xercesc_4_0::Grammar,_xercesc_4_0::StringHasher>::
          ~RefHashTableOfEnumerator
                    ((RefHashTableOfEnumerator<xercesc_4_0::Grammar,_xercesc_4_0::StringHasher> *)
                     local_80);
        }
        pXVar6 = (this->super_XMLScanner).fValidator;
        if ((pXVar6 != (XMLValidator *)0x0) &&
           (iVar10 = (*pXVar6->_vptr_XMLValidator[0xd])(), pXVar9 = local_90, (char)iVar10 != '\0'))
        {
          if (pXVar14 == L"type") {
LAB_002af373:
            pXVar18 = XMLBufferMgr::bidOnBuffer(local_90);
            local_80._8_8_ = pXVar9;
            uVar19 = 0x51;
            uVar5 = 0x4e;
            puVar25 = &DAT_00372bfc;
            do {
              uVar19 = (ulong)uVar5 + (uVar19 >> 0x18) + uVar19 * 0x26;
              uVar5 = *puVar25;
              puVar25 = puVar25 + 1;
            } while (uVar5 != 0);
            for (puVar17 = *(undefined8 **)
                            (*(long *)(DatatypeValidatorFactory::fBuiltInRegistry + 0x10) +
                            (uVar19 % *(ulong *)(DatatypeValidatorFactory::fBuiltInRegistry + 0x18))
                            * 8); puVar17 != (undefined8 *)0x0; puVar17 = (undefined8 *)puVar17[1])
            {
              puVar7 = (undefined2 *)puVar17[2];
              if (puVar7 == &SchemaSymbols::fgDT_QNAME) goto LAB_002af42e;
              sVar23 = 0x51;
              if (puVar7 == (undefined2 *)0x0) {
LAB_002af421:
                if (sVar23 == 0) goto LAB_002af42e;
              }
              else {
                lVar24 = 0;
                do {
                  psVar1 = (short *)((long)&SchemaSymbols::fgDT_QNAME + lVar24);
                  if (*psVar1 == 0) {
                    sVar23 = *(short *)((long)puVar7 + lVar24);
                    goto LAB_002af421;
                  }
                  psVar2 = (short *)((long)puVar7 + lVar24);
                  lVar24 = lVar24 + 2;
                } while (*psVar1 == *psVar2);
              }
            }
            puVar17 = (undefined8 *)0x0;
LAB_002af42e:
            if (puVar17 == (undefined8 *)0x0) {
              pDVar22 = (DatatypeValidator *)0x0;
            }
            else {
              pDVar22 = (DatatypeValidator *)*puVar17;
            }
            local_80._0_8_ = pXVar18;
            normalizeAttRawValue(this,L"type",pXVar13,pXVar18);
            pSVar8 = (SchemaValidator *)(this->super_XMLScanner).fValidator;
            pXVar14 = pXVar18->fBuffer;
            pXVar14[pXVar18->fIndex] = L'\0';
            SchemaValidator::normalizeWhiteSpace(pSVar8,pDVar22,pXVar14,pXVar18,true);
            if (pXVar18->fIndex != 0) {
              local_9c = -1;
              pXVar14 = pXVar18->fBuffer;
              pXVar14[pXVar18->fIndex] = L'\0';
              uVar11 = XMLScanner::resolveQName
                                 (&this->super_XMLScanner,pXVar14,local_50,Mode_Element,&local_9c);
              pXVar6 = (this->super_XMLScanner).fValidator;
              local_38 = (this->super_XMLScanner).fPrefixBuf.fBuffer;
              local_38[(this->super_XMLScanner).fPrefixBuf.fIndex] = L'\0';
              local_40 = pXVar18->fBuffer;
              local_40[pXVar18->fIndex] = L'\0';
              local_48 = (long)local_9c;
              if (pXVar6[1].fReaderMgr != (ReaderMgr *)0x0) {
                (*((pXVar6[1].fReaderMgr)->super_Locator)._vptr_Locator[1])();
              }
              this_00 = (ReaderMgr *)
                        XMemory::operator_new(0x48,(MemoryManager *)pXVar6[1]._vptr_XMLValidator);
              QName::QName((QName *)this_00,local_38,local_40 + local_48 + 1,uVar11,
                           (MemoryManager *)pXVar6[1]._vptr_XMLValidator);
              pXVar6[1].fReaderMgr = this_00;
            }
            XMLBufferMgr::releaseBuffer((XMLBufferMgr *)local_80._8_8_,(XMLBuffer *)local_80._0_8_);
          }
          else {
            pXVar15 = L"type";
            if (pXVar14 == (XMLCh *)0x0) {
LAB_002af327:
              if (*pXVar15 == L'\0') goto LAB_002af373;
            }
            else {
              pXVar15 = L"type";
              pXVar21 = pXVar14;
              do {
                XVar3 = *pXVar21;
                if (XVar3 == L'\0') goto LAB_002af327;
                pXVar21 = pXVar21 + 1;
                XVar4 = *pXVar15;
                pXVar15 = pXVar15 + 1;
              } while (XVar3 == XVar4);
            }
            if (pXVar14 == L"nil") {
LAB_002af555:
              pXVar18 = XMLBufferMgr::bidOnBuffer(local_90);
              local_80._8_8_ = pXVar9;
              uVar19 = 0x62;
              uVar5 = 0x6f;
              puVar25 = &DAT_00372984;
              do {
                uVar19 = (ulong)uVar5 + (uVar19 >> 0x18) + uVar19 * 0x26;
                uVar5 = *puVar25;
                puVar25 = puVar25 + 1;
              } while (uVar5 != 0);
              for (puVar17 = *(undefined8 **)
                              (*(long *)(DatatypeValidatorFactory::fBuiltInRegistry + 0x10) +
                              (uVar19 % *(ulong *)(DatatypeValidatorFactory::fBuiltInRegistry + 0x18
                                                  )) * 8); puVar17 != (undefined8 *)0x0;
                  puVar17 = (undefined8 *)puVar17[1]) {
                puVar7 = (undefined2 *)puVar17[2];
                if (puVar7 == &SchemaSymbols::fgDT_BOOLEAN) goto LAB_002af610;
                sVar23 = 0x62;
                if (puVar7 == (undefined2 *)0x0) {
LAB_002af603:
                  if (sVar23 == 0) goto LAB_002af610;
                }
                else {
                  lVar24 = 0;
                  do {
                    psVar1 = (short *)((long)&SchemaSymbols::fgDT_BOOLEAN + lVar24);
                    if (*psVar1 == 0) {
                      sVar23 = *(short *)((long)puVar7 + lVar24);
                      goto LAB_002af603;
                    }
                    psVar2 = (short *)((long)puVar7 + lVar24);
                    lVar24 = lVar24 + 2;
                  } while (*psVar1 == *psVar2);
                }
              }
              puVar17 = (undefined8 *)0x0;
LAB_002af610:
              if (puVar17 == (undefined8 *)0x0) {
                pDVar22 = (DatatypeValidator *)0x0;
              }
              else {
                pDVar22 = (DatatypeValidator *)*puVar17;
              }
              local_80._0_8_ = pXVar18;
              normalizeAttRawValue(this,L"nil",pXVar13,pXVar18);
              pSVar8 = (SchemaValidator *)(this->super_XMLScanner).fValidator;
              pXVar14 = pXVar18->fBuffer;
              pXVar14[pXVar18->fIndex] = L'\0';
              SchemaValidator::normalizeWhiteSpace(pSVar8,pDVar22,pXVar14,pXVar18,true);
              XVar26 = pXVar18->fIndex;
              pXVar14 = pXVar18->fBuffer;
              pXVar14[XVar26] = L'\0';
              uVar20 = 1;
              if (pXVar14 == L"true") {
LAB_002af70b:
                pXVar6 = (this->super_XMLScanner).fValidator;
                *(undefined1 *)&pXVar6[1].fScanner = uVar20;
                *(undefined1 *)((long)&pXVar6[1].fScanner + 1) = 1;
              }
              else {
                pXVar15 = L"true";
                if (pXVar14 == (XMLCh *)0x0) {
LAB_002af6a3:
                  if (*pXVar15 == L'\0') goto LAB_002af70b;
                }
                else {
                  pXVar15 = L"true";
                  pXVar21 = pXVar14;
                  do {
                    XVar3 = *pXVar21;
                    if (XVar3 == L'\0') goto LAB_002af6a3;
                    pXVar21 = pXVar21 + 1;
                    XVar4 = *pXVar15;
                    pXVar15 = pXVar15 + 1;
                  } while (XVar3 == XVar4);
                }
                pXVar14[XVar26] = L'\0';
                pXVar15 = L"false";
                if (pXVar14 == L"false") {
LAB_002af709:
                  uVar20 = 0;
                  goto LAB_002af70b;
                }
                if (pXVar14 == (XMLCh *)0x0) {
LAB_002af6e4:
                  if (*pXVar15 == L'\0') goto LAB_002af709;
                }
                else {
                  pXVar15 = L"false";
                  pXVar21 = pXVar14;
                  do {
                    XVar3 = *pXVar21;
                    if (XVar3 == L'\0') goto LAB_002af6e4;
                    pXVar21 = pXVar21 + 1;
                    XVar4 = *pXVar15;
                    pXVar15 = pXVar15 + 1;
                  } while (XVar3 == XVar4);
                }
                pXVar14[XVar26] = L'\0';
                XMLScanner::emitError
                          (&this->super_XMLScanner,InvalidAttValue,pXVar14,pXVar13,(XMLCh *)0x0,
                           (XMLCh *)0x0);
              }
              XMLBufferMgr::releaseBuffer
                        ((XMLBufferMgr *)local_80._8_8_,(XMLBuffer *)local_80._0_8_);
            }
            else {
              pXVar15 = L"nil";
              if (pXVar14 == (XMLCh *)0x0) {
LAB_002af54b:
                if (*pXVar15 == L'\0') goto LAB_002af555;
              }
              else {
                pXVar15 = L"nil";
                do {
                  XVar3 = *pXVar14;
                  if (XVar3 == L'\0') goto LAB_002af54b;
                  pXVar14 = pXVar14 + 1;
                  XVar4 = *pXVar15;
                  pXVar15 = pXVar15 + 1;
                } while (XVar3 == XVar4);
              }
            }
          }
        }
      }
      else {
        pXVar15 = L"type";
        if (pXVar14 != (XMLCh *)0x0) {
          pXVar15 = L"type";
          pXVar21 = pXVar14;
          do {
            XVar3 = *pXVar21;
            if (XVar3 == L'\0') goto LAB_002af206;
            pXVar21 = pXVar21 + 1;
            XVar4 = *pXVar15;
            pXVar15 = pXVar15 + 1;
          } while (XVar3 == XVar4);
          if (pXVar14 != L"nil") goto LAB_002af215;
          goto LAB_002af252;
        }
LAB_002af206:
        if ((pXVar14 == L"nil") || (*pXVar15 == L'\0')) goto LAB_002af252;
LAB_002af215:
        pXVar15 = L"nil";
        if (pXVar14 == (XMLCh *)0x0) {
LAB_002af248:
          if (*pXVar15 == L'\0') goto LAB_002af252;
        }
        else {
          pXVar15 = L"nil";
          pXVar21 = pXVar14;
          do {
            XVar3 = *pXVar21;
            if (XVar3 == L'\0') goto LAB_002af248;
            pXVar21 = pXVar21 + 1;
            XVar4 = *pXVar15;
            pXVar15 = pXVar15 + 1;
          } while (XVar3 == XVar4);
        }
      }
LAB_002af728:
      XVar27 = XVar27 + 1;
    } while (XVar27 != local_98);
  }
  return;
}

Assistant:

void IGXMLScanner::scanRawAttrListforNameSpaces(XMLSize_t attCount)
{
    //  Make an initial pass through the list and find any xmlns attributes or
    //  schema attributes.
    //  When we find one, send it off to be used to update the element stack's
    //  namespace mappings.
    for (XMLSize_t index = 0; index < attCount; index++)
    {
        // each attribute has the prefix:suffix="value"
        const KVStringPair* curPair = fRawAttrList->elementAt(index);
        const XMLCh* rawPtr = curPair->getKey();

        //  If either the key begins with "xmlns:" or its just plain
        //  "xmlns", then use it to update the map.
        if (!XMLString::compareNString(rawPtr, XMLUni::fgXMLNSColonString, 6)
        ||  XMLString::equals(rawPtr, XMLUni::fgXMLNSString))
        {
            const XMLCh* valuePtr = curPair->getValue();

            updateNSMap(rawPtr, valuePtr, fRawAttrColonList[index]);

            // if the schema URI is seen in the the valuePtr, set the boolean seeXsi
            if (XMLString::equals(valuePtr, SchemaSymbols::fgURI_XSI)) {
                fSeeXsi = true;
            }
        }
    }

    // walk through the list again to deal with "xsi:...."
    if (fDoSchema && fSeeXsi)
    {
        for (XMLSize_t index = 0; index < attCount; index++)
        {
            // each attribute has the prefix:suffix="value"
            const KVStringPair* curPair = fRawAttrList->elementAt(index);
            const XMLCh* rawPtr = curPair->getKey();
            const XMLCh* prefPtr = XMLUni::fgZeroLenString;
            int   colonInd = fRawAttrColonList[index];

            if (colonInd != -1) {

                fURIBuf.set(rawPtr, colonInd);
                prefPtr = fURIBuf.getRawBuffer();
            }

            // if schema URI has been seen, scan for the schema location and uri
            // and resolve the schema grammar
            if (resolvePrefix(prefPtr, ElemStack::Mode_Attribute) == fSchemaNamespaceId) {

                const XMLCh* valuePtr = curPair->getValue();
                const XMLCh* suffPtr = &rawPtr[colonInd + 1];

                if (XMLString::equals(suffPtr, SchemaSymbols::fgXSI_SCHEMALOCATION))
                    parseSchemaLocation(valuePtr);
                else if (XMLString::equals(suffPtr, SchemaSymbols::fgXSI_NONAMESPACESCHEMALOCATION))
                    resolveSchemaGrammar(valuePtr, XMLUni::fgZeroLenString);
            }
        }

        // do it another time, as xsi:type and xsi:nill only work if the schema grammar has been already
        // loaded (JIRA XERCESC-1937)
        for (XMLSize_t index = 0; index < attCount; index++)
        {
            const KVStringPair* curPair = fRawAttrList->elementAt(index);
            const XMLCh* rawPtr = curPair->getKey();
            const XMLCh* prefPtr = XMLUni::fgZeroLenString;
            int   colonInd = fRawAttrColonList[index];

            if (colonInd != -1) {

                fURIBuf.set(rawPtr, colonInd);
                prefPtr = fURIBuf.getRawBuffer();
            }

            // scan for schema type
            if (resolvePrefix(prefPtr, ElemStack::Mode_Attribute) == fSchemaNamespaceId) {

                const XMLCh* valuePtr = curPair->getValue();
                const XMLCh*  suffPtr = &rawPtr[colonInd + 1];

                if(XMLString::equals(suffPtr, SchemaSymbols::fgXSI_TYPE) ||
                   XMLString::equals(suffPtr, SchemaSymbols::fgATT_NILL))
                {
                    if (!fValidator || !fValidator->handlesSchema())
                    {
                        // If we are in the DTD mode, try to switch to the Schema
                        // mode. For that we need to find any XML Schema grammar
                        // that we can switch to. Such a grammar can only come
                        // from the cache (if it came from the schemaLocation
                        // attribute, we would be in the Schema mode already).
                        //
                        XMLGrammarPool* pool = fGrammarResolver->getGrammarPool ();
                        RefHashTableOfEnumerator<Grammar> i = pool->getGrammarEnumerator ();

                        while (i.hasMoreElements ())
                        {
                            Grammar& gr (i.nextElement ());

                            if (gr.getGrammarType () == Grammar::SchemaGrammarType)
                            {
                                switchGrammar (gr.getTargetNamespace ());
                                break;
                            }
                        }
                    }

                    if( fValidator && fValidator->handlesSchema() )
                    {
                        if (XMLString::equals(suffPtr, SchemaSymbols::fgXSI_TYPE))
                        {
                            XMLBufBid bbXsi(&fBufMgr);
                            XMLBuffer& fXsiType = bbXsi.getBuffer();

                            // normalize the attribute according to schema whitespace facet
                            DatatypeValidator* tempDV = DatatypeValidatorFactory::getBuiltInRegistry()->get(SchemaSymbols::fgDT_QNAME);
                            normalizeAttRawValue(SchemaSymbols::fgXSI_TYPE, valuePtr, fXsiType);
                            ((SchemaValidator*) fValidator)->normalizeWhiteSpace(tempDV, fXsiType.getRawBuffer(), fXsiType, true);
                            if (!fXsiType.isEmpty()) {
                                int colonPos = -1;
                                unsigned int uriId = resolveQName (
                                      fXsiType.getRawBuffer()
                                    , fPrefixBuf
                                    , ElemStack::Mode_Element
                                    , colonPos
                                );
                                ((SchemaValidator*)fValidator)->setXsiType(fPrefixBuf.getRawBuffer(), fXsiType.getRawBuffer() + colonPos + 1, uriId);
                            }
                        }
                        else if (XMLString::equals(suffPtr, SchemaSymbols::fgATT_NILL))
                        {
                            // normalize the attribute according to schema whitespace facet
                            XMLBufBid bbXsi(&fBufMgr);
                            XMLBuffer& fXsiNil = bbXsi.getBuffer();

                            DatatypeValidator* tempDV = DatatypeValidatorFactory::getBuiltInRegistry()->get(SchemaSymbols::fgDT_BOOLEAN);
                            normalizeAttRawValue(SchemaSymbols::fgATT_NILL, valuePtr, fXsiNil);
                            ((SchemaValidator*) fValidator)->normalizeWhiteSpace(tempDV, fXsiNil.getRawBuffer(), fXsiNil, true);
                            if(XMLString::equals(fXsiNil.getRawBuffer(), SchemaSymbols::fgATTVAL_TRUE))
                                ((SchemaValidator*)fValidator)->setNillable(true);
                            else if(XMLString::equals(fXsiNil.getRawBuffer(), SchemaSymbols::fgATTVAL_FALSE))
                                ((SchemaValidator*)fValidator)->setNillable(false);
                            else
                                emitError(XMLErrs::InvalidAttValue, fXsiNil.getRawBuffer(), valuePtr);
                        }
                    }
                }
            }
        }
    }

}